

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# POSG.cpp
# Opt level: O2

void __thiscall POSG::SetNrAgents(POSG *this,size_t nrAgents)

{
  allocator_type local_39;
  value_type_conflict3 local_38;
  _Vector_base<double,_std::allocator<double>_> local_30;
  
  if (this->_m_initialized == false) {
    nrAgents = this->_m_nrAgents;
  }
  else {
    this->_m_initialized = false;
    this->_m_nrAgents = nrAgents;
  }
  local_38 = 1.0;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&local_30,nrAgents,&local_38,&local_39);
  std::vector<double,_std::allocator<double>_>::_M_move_assign(&this->_m_discount,&local_30);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_30);
  local_38 = (value_type_conflict3)((ulong)local_38 & 0xffffffff00000000);
  std::vector<Globals::reward_t,_std::allocator<Globals::reward_t>_>::vector
            ((vector<Globals::reward_t,_std::allocator<Globals::reward_t>_> *)&local_30,
             this->_m_nrAgents,(value_type *)&local_38,(allocator_type *)&local_39);
  std::vector<Globals::reward_t,_std::allocator<Globals::reward_t>_>::_M_move_assign
            (&this->_m_rewardType,&local_30);
  std::_Vector_base<Globals::reward_t,_std::allocator<Globals::reward_t>_>::~_Vector_base
            ((_Vector_base<Globals::reward_t,_std::allocator<Globals::reward_t>_> *)&local_30);
  return;
}

Assistant:

void POSG::SetNrAgents (size_t nrAgents)
{
    if(_m_initialized)
    {
        //do some de-initialization things ?
        _m_initialized = false;
        _m_nrAgents = nrAgents;
    }    

    _m_discount = vector<double>(_m_nrAgents, 1.0);
    _m_rewardType = vector<reward_t>(_m_nrAgents, REWARD);

}